

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog_impl.h
# Opt level: O2

shared_ptr<spdlog::logger> __thiscall
spdlog::create<spdlog::sinks::null_sink<spdlog::details::null_mutex>>
          (spdlog *this,string *logger_name)

{
  registry_t<std::mutex> *logger_name_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<spdlog::logger> sVar1;
  sinks_init_list sinks;
  __shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::make_shared<spdlog::sinks::null_sink<spdlog::details::null_mutex>>();
  local_38._M_ptr = local_48._M_ptr;
  local_38._M_refcount._M_pi = local_48._M_refcount._M_pi;
  local_48._M_ptr = (element_type *)0x0;
  local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  logger_name_00 = details::registry_t<std::mutex>::instance();
  std::__shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,&local_38);
  sinks._M_len = (size_type)&local_48;
  sinks._M_array = (iterator)logger_name;
  details::registry_t<std::mutex>::create
            ((registry_t<std::mutex> *)this,(string *)logger_name_00,sinks);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<spdlog::logger>)
         sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<spdlog::logger> spdlog::create(const std::string &logger_name, Args... args)
{
    sink_ptr sink = std::make_shared<Sink>(args...);
    return details::registry::instance().create(logger_name, {sink});
}